

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
libcellml::Units::unitAttributes
          (Units *this,StandardUnit standardUnit,string *prefix,double *exponent,double *multiplier,
          string *id)

{
  UnitsImpl *pUVar1;
  mapped_type *reference;
  size_t index;
  __normal_iterator<const_libcellml::UnitDefinition_*,_std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>_>
  local_78 [3];
  __normal_iterator<const_libcellml::UnitDefinition_*,_std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>_>
  local_60;
  undefined1 local_58 [8];
  string dummyReference;
  string *id_local;
  double *multiplier_local;
  double *exponent_local;
  string *prefix_local;
  Units *pUStack_10;
  StandardUnit standardUnit_local;
  Units *this_local;
  
  dummyReference.field_2._8_8_ = id;
  prefix_local._4_4_ = standardUnit;
  pUStack_10 = this;
  std::__cxx11::string::string((string *)local_58);
  pUVar1 = pFunc(this);
  reference = std::
              map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)standardUnitToString_abi_cxx11_,(key_type *)((long)&prefix_local + 4));
  local_60._M_current = (UnitDefinition *)UnitsImpl::findUnit(pUVar1,reference);
  pUVar1 = pFunc(this);
  local_78[0]._M_current =
       (UnitDefinition *)
       std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::begin
                 (&pUVar1->mUnitDefinitions);
  index = __gnu_cxx::operator-(&local_60,local_78);
  unitAttributes(this,index,(string *)local_58,prefix,exponent,multiplier,
                 (string *)dummyReference.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void Units::unitAttributes(StandardUnit standardUnit, std::string &prefix, double &exponent, double &multiplier, std::string &id) const
{
    std::string dummyReference;
    unitAttributes(static_cast<size_t>(pFunc()->findUnit(standardUnitToString.at(standardUnit)) - pFunc()->mUnitDefinitions.begin()), dummyReference, prefix, exponent, multiplier, id);
}